

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCRef * __thiscall
NULLCTypeInfo::GetInstanceByName
          (NULLCRef *__return_storage_ptr__,NULLCTypeInfo *this,NULLCArray name)

{
  NULLCArray name_00;
  TypeID typeID_00;
  char *pcVar1;
  TypeID typeID;
  NULLCArray name_local;
  
  memset(__return_storage_ptr__,0,0xc);
  name_00.len = (uint)name.ptr;
  name_00.ptr = (char *)this;
  typeID_00 = GetType(name_00);
  if (typeID_00.typeID != 0) {
    pcVar1 = (char *)nullcAllocateTyped(typeID_00.typeID);
    __return_storage_ptr__->ptr = pcVar1;
    __return_storage_ptr__->typeID = typeID_00.typeID;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef GetInstanceByName(NULLCArray name)
	{
		NULLCRef r = { 0, 0 };

		TypeID typeID = GetType(name);
		if(!typeID.typeID)
			return r;

		r.ptr = (char*)nullcAllocateTyped(typeID.typeID);
		r.typeID = typeID.typeID;
		return r;
	}